

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O2

void InitGLRMapinfoData(void)

{
  level_info_t *this;
  SBYTE SVar1;
  FGLROptions *pFVar2;
  SBYTE SVar3;
  SBYTE SVar4;
  byte bVar5;
  FName local_1c;
  
  this = level.info;
  FName::FName(&local_1c,"gl_renderer");
  pFVar2 = level_info_t::GetOptData<FGLROptions>(this,&local_1c,false);
  if (pFVar2 == (FGLROptions *)0x0) {
    gl_SetFogParams(0,(PalEntry)(level.info)->outsidefog,0,0);
    glset.map_lightmode = -1;
    glset.map_nocoloredspritelighting = -1;
    glset.map_notexturefill = -1;
    glset.map_brightfog = -1;
    glset.skyrotatevector2.Y = 0.0;
    glset.skyrotatevector2.Z = 1.0;
    glset.skyrotatevector.X = 0.0;
    glset.skyrotatevector.Y = 0.0;
    glset.skyrotatevector.Z = 1.0;
    glset.skyrotatevector2.X = 0.0;
    glset.pixelstretch = 1.2;
    SVar4 = -1;
    SVar3 = -1;
    SVar1 = -1;
  }
  else {
    gl_SetFogParams(*(int *)&(pFVar2->super_FOptionalMapinfoData).field_0x14,
                    (PalEntry)(level.info)->outsidefog,pFVar2->outsidefogdensity,pFVar2->skyfog);
    glset.map_lightmode = (SBYTE)pFVar2->lightmode;
    SVar1 = (SBYTE)pFVar2->brightfog;
    SVar4 = pFVar2->nocoloredspritelighting;
    glset.map_nocoloredspritelighting = SVar4;
    SVar3 = pFVar2->notexturefill;
    glset.map_notexturefill = SVar3;
    glset.map_brightfog = SVar1;
    glset.pixelstretch = pFVar2->pixelstretch;
    glset.skyrotatevector2.Y = (pFVar2->skyrotatevector2).Y;
    glset.skyrotatevector2.Z = (pFVar2->skyrotatevector2).Z;
    glset.skyrotatevector.X = (pFVar2->skyrotatevector).X;
    glset.skyrotatevector.Y = (pFVar2->skyrotatevector).Y;
    glset._16_8_ = *(undefined8 *)&(pFVar2->skyrotatevector).Z;
    if (((byte)glset.map_lightmode < 9) &&
       (glset.lightmode = glset.map_lightmode,
       (0x11fU >> ((byte)glset.map_lightmode & 0x1f) & 1) != 0)) goto LAB_0038a14e;
  }
  glset.lightmode = (byte)gl_lightmode.Value;
LAB_0038a14e:
  bVar5 = SVar4 != '\0';
  if (SVar4 == -1) {
    bVar5 = gl_nocoloredspritelighting.Value;
  }
  glset.nocoloredspritelighting = (bool)(bVar5 & 1);
  bVar5 = SVar3 != '\0';
  if (SVar3 == -1) {
    bVar5 = gl_notexturefill.Value;
  }
  glset.notexturefill = (bool)(bVar5 & 1);
  bVar5 = SVar1 != '\0';
  if (SVar1 == -1) {
    bVar5 = gl_brightfog.Value;
  }
  glset.brightfog = (bool)(bVar5 & 1);
  return;
}

Assistant:

void InitGLRMapinfoData()
{
	FGLROptions *opt = level.info->GetOptData<FGLROptions>("gl_renderer", false);

	if (opt != NULL)
	{
		gl_SetFogParams(opt->fogdensity, level.info->outsidefog, opt->outsidefogdensity, opt->skyfog);
		glset.map_lightmode = opt->lightmode;
		glset.map_brightfog = opt->brightfog;
		glset.map_nocoloredspritelighting = opt->nocoloredspritelighting;
		glset.map_notexturefill = opt->notexturefill;
		glset.skyrotatevector = opt->skyrotatevector;
		glset.skyrotatevector2 = opt->skyrotatevector2;
		glset.pixelstretch = opt->pixelstretch;
	}
	else
	{
		gl_SetFogParams(0, level.info->outsidefog, 0, 0);
		glset.map_lightmode = -1;
		glset.map_brightfog = -1;
		glset.map_nocoloredspritelighting = -1;
		glset.map_notexturefill = -1;
		glset.skyrotatevector = FVector3(0,0,1);
		glset.skyrotatevector2 = FVector3(0,0,1);
		glset.pixelstretch = 1.2f;
	}

	if (!IsLightmodeValid()) glset.lightmode = gl_lightmode;
	else glset.lightmode = glset.map_lightmode;
	if (glset.map_nocoloredspritelighting == -1) glset.nocoloredspritelighting = gl_nocoloredspritelighting;
	else glset.nocoloredspritelighting = !!glset.map_nocoloredspritelighting;
	if (glset.map_notexturefill == -1) glset.notexturefill = gl_notexturefill;
	else glset.notexturefill = !!glset.map_notexturefill;
	if (glset.map_brightfog == -1) glset.brightfog = gl_brightfog;
	else glset.brightfog = !!glset.map_brightfog;
}